

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdrive.c
# Opt level: O3

int main(int argc,char **argv)

{
  trans_t trans;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  singlecomplex *psVar5;
  singlecomplex *x;
  int *piVar6;
  float *pfVar7;
  float *extraout_RAX;
  float *extraout_RAX_00;
  float *extraout_RAX_01;
  float *extraout_RAX_02;
  float *extraout_RAX_03;
  ulong uVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  uint uVar10;
  FILE *unaff_RBX;
  int *perm_c;
  yes_no_t yVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  fact_t fVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  int n;
  int m;
  char local_471;
  uint local_470;
  uint local_46c;
  int_t info;
  int_t nnz;
  double local_460;
  int local_454;
  float colcnd;
  float rowcnd;
  ulong local_448;
  int lda;
  ulong local_438;
  float *local_430;
  uint local_424;
  yes_no_t local_420;
  fact_t local_41c;
  singlecomplex *local_418;
  float *local_410;
  float *local_408;
  int *local_400;
  int *local_3f8;
  ulong local_3f0;
  singlecomplex *local_3e8;
  int local_3dc;
  int local_3d8;
  uint local_3d4;
  int local_3d0;
  int kl;
  float amax;
  int info1;
  long local_3c0;
  singlecomplex *local_3b8;
  void *local_3b0;
  int *local_3a8;
  float *local_3a0;
  float *local_398;
  singlecomplex *local_390;
  singlecomplex *local_388;
  int_t *xa;
  int_t *asub;
  singlecomplex *a;
  float *local_368;
  int *local_360;
  singlecomplex *local_358;
  ulong local_350;
  ulong local_348;
  uint local_340;
  float cndnum;
  float anorm;
  int mode;
  int ku;
  float rcond;
  SuperMatrix A;
  float result [5];
  int_t *xa_save;
  int_t *asub_save;
  singlecomplex *a_save;
  SuperMatrix U;
  SuperMatrix L;
  float rpg;
  mem_usage_t mem_usage;
  SuperMatrix ASAV;
  int iseed [4];
  SuperLUStat_t stat;
  SuperMatrix X;
  SuperMatrix B;
  superlu_options_t options;
  SuperMatrix AC;
  GlobalLU_t Glu;
  
  iseed[0] = 0x7c4;
  iseed[1] = 0x7c5;
  iseed[2] = 0x7c6;
  iseed[3] = 0x7c7;
  builtin_strncpy(main::path,"CGE",4);
  n = 1;
  local_470 = 1;
  local_3d8 = sp_ienv(1);
  local_3dc = sp_ienv(2);
  main::matrix_type[0] = 'L';
  main::matrix_type[1] = 'A';
  main::matrix_type[2] = '\0';
  local_460 = 1.0;
  local_448 = 0;
  do {
    iVar3 = getopt(argc,argv,"ht:n:w:r:s:m:b:c:l:u:f:");
    switch(iVar3) {
    case 0x66:
      unaff_RBX = fopen(_optarg,"r");
      if (unaff_RBX == (FILE *)0x0) {
        sprintf((char *)&Glu,"%s at line %d in file %s\n","File does not exist",0x239,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
               );
        superlu_abort_and_exit((char *)&Glu);
      }
      printf(".. test sparse matrix in file: %s\n",_optarg);
      break;
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x76:
      break;
    case 0x68:
      puts("Options:");
      puts("\t-w <int> - panel size");
      puts("\t-r <int> - granularity of relaxed supernodes");
      exit(1);
    case 0x6c:
      iVar3 = atoi(_optarg);
      local_448 = CONCAT44(extraout_var,iVar3);
      break;
    case 0x6e:
      n = atoi(_optarg);
      break;
    case 0x72:
      local_3dc = atoi(_optarg);
      break;
    case 0x73:
      local_470 = atoi(_optarg);
      break;
    case 0x74:
      strcpy(main::matrix_type,_optarg);
      break;
    case 0x75:
      local_460 = atof(_optarg);
      break;
    case 0x77:
      local_3d8 = atoi(_optarg);
      break;
    default:
      if (iVar3 == -1) {
        if ((int)local_448 < 1) {
LAB_0010177c:
          local_3b0 = (void *)0x0;
        }
        else {
          local_3b0 = superlu_malloc(local_448 & 0xffffffff);
          if (local_3b0 == (void *)0x0) {
            main_cold_1();
            goto LAB_0010177c;
          }
        }
        uVar2 = local_470;
        set_default_options(&options);
        options.DiagPivotThresh = local_460;
        options.PrintStat = NO;
        options.PivotGrowth = YES;
        options.ConditionNumber = YES;
        options.IterRefine = SLU_SINGLE;
        if (main::matrix_type[2] == '\0' && main::matrix_type._0_2_ == 0x414c) {
          m = n;
          uVar17 = 1;
          lda = 1;
          if (1 < n) {
            lda = n;
          }
          nnz = n * n;
          local_3e8 = singlecomplexCalloc((long)(lda * n));
          callocateA(n,nnz,&a,&asub,&xa);
          local_424 = 0xb;
        }
        else {
          creadhb((FILE *)unaff_RBX,&m,&n,&nnz,&a,&asub,&xa);
          uVar17 = 0;
          local_424 = 0;
        }
        callocateA(n,nnz,&a_save,&asub_save,&xa_save);
        lVar14 = (long)(int)uVar2;
        psVar5 = singlecomplexMalloc(m * lVar14);
        local_388 = singlecomplexMalloc(m * lVar14);
        x = singlecomplexMalloc(n * lVar14);
        local_390 = singlecomplexMalloc(n * lVar14);
        iVar3 = n;
        if (n < m) {
          iVar3 = m;
        }
        uVar10 = 4;
        if (4 < (int)uVar2) {
          uVar10 = uVar2;
        }
        local_3b8 = singlecomplexCalloc((long)(int)(iVar3 * uVar10));
        iVar3 = n;
        local_350 = (ulong)(uint)m;
        uVar15 = (ulong)(uint)n;
        local_358 = psVar5;
        cCreate_Dense_Matrix(&B,m,uVar2,psVar5,m,SLU_DN,SLU_C,SLU_GE);
        local_438 = uVar15;
        local_418 = x;
        cCreate_Dense_Matrix(&X,n,uVar2,x,iVar3,SLU_DN,SLU_C,SLU_GE);
        local_360 = int32Malloc(n);
        local_3f8 = int32Malloc(n);
        local_400 = int32Malloc(n);
        piVar6 = int32Malloc(n);
        local_408 = (float *)superlu_malloc((long)m << 2);
        local_410 = (float *)superlu_malloc((long)n << 2);
        local_398 = (float *)superlu_malloc(lVar14 << 2);
        local_3a0 = (float *)superlu_malloc(lVar14 << 2);
        iVar3 = n;
        if (n < m) {
          iVar3 = m;
        }
        uVar10 = iVar3 * uVar10;
        local_368 = (float *)superlu_malloc((long)(int)uVar10 * 4);
        pfVar7 = local_368;
        if (0 < (int)uVar10) {
          pfVar7 = (float *)memset(local_368,0,(ulong)uVar10 << 2);
        }
        if (local_408 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R",0xc2,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
          pfVar7 = extraout_RAX;
        }
        perm_c = local_400;
        if (local_410 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C",0xc3,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
          pfVar7 = extraout_RAX_00;
        }
        if (local_398 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ferr",0xc4,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
          pfVar7 = extraout_RAX_01;
        }
        if (local_3a0 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for berr",0xc5,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
          pfVar7 = extraout_RAX_02;
        }
        if (local_368 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork",0xc6,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
          pfVar7 = extraout_RAX_03;
        }
        if (0 < n) {
          pfVar7 = (float *)0x0;
          do {
            piVar6[(long)pfVar7] = (int)pfVar7;
            perm_c[(long)pfVar7] = (int)pfVar7;
            pfVar7 = (float *)((long)pfVar7 + 1);
          } while ((long)pfVar7 < (long)n);
        }
        options.ColPerm = MY_PERMC;
        local_454 = 0;
        uVar15 = 0;
        local_46c = uVar17;
        if (local_424 < uVar17) goto LAB_00101bf7;
        uVar15 = 0;
        local_454 = 0;
        local_430 = pfVar7;
        local_3a8 = piVar6;
        do {
          local_46c = uVar17;
          if (uVar17 == 0) {
            local_430 = (float *)(ulong)(n + 1);
            local_471 = '\x01';
            uVar18 = local_438;
LAB_00102008:
            cCreate_CompCol_Matrix(&A,m,n,nnz,a,asub,xa,SLU_NC,SLU_C,SLU_GE);
            cCreate_CompCol_Matrix(&ASAV,m,n,nnz,a_save,asub_save,xa_save,SLU_NC,SLU_C,SLU_GE);
            cCopy_CompCol_Matrix(&A,&ASAV);
            cGenXtrue(n,local_470,local_390,(int)uVar18);
            StatInit(&stat);
            local_3d0 = (int)local_430 + -1;
            lVar14 = 0;
            do {
              main::equed[0] = "NRCB"[lVar14];
              uVar12 = 0;
              local_3c0 = lVar14;
              do {
                options.Fact = main::facts[uVar12];
                local_3d4 = (uint)CONCAT71((uint7)(uint3)(options.Fact >> 8),1);
                yVar11 = NO;
                local_3f0 = uVar12;
                do {
                  fVar16 = options.Fact & ~SamePattern;
                  options.Equil = yVar11;
                  cCopy_CompCol_Matrix(&ASAV,&A);
                  uVar9 = extraout_RDX;
                  if (local_471 == '\0') {
                    uVar8 = local_3f0;
                    if (fVar16 != SamePattern_SameRowPerm) {
                      local_420 = yVar11 | (yes_no_t)local_3c0;
                      local_41c = fVar16;
                      goto LAB_00102342;
                    }
                  }
                  else {
                    yVar11 = yVar11 | (yes_no_t)local_3c0;
                    local_41c = fVar16;
                    if ((yVar11 != NO) && (options.Fact == FACTORED)) {
                      cgsequ(&A,local_408,local_410,&rowcnd,&colcnd,&amax,&info1);
                      if ((info == 0) && (0 < n)) {
                        if (main::equed[0] == 'B') {
                          rowcnd = 0.0;
                          colcnd = 0.0;
                        }
                        else if (main::equed[0] == 'C') {
                          rowcnd = 1.0;
                          colcnd = 0.0;
                        }
                        else if (main::equed[0] == 'R') {
                          rowcnd = 0.0;
                          colcnd = 1.0;
                        }
                      }
                      claqgs(&A,local_408,local_410,rowcnd,colcnd,amax,main::equed);
                      uVar9 = extraout_RDX_00;
                    }
                    piVar6 = local_360;
                    local_420 = yVar11;
                    if (local_41c == SamePattern_SameRowPerm) {
                      local_460 = (double)CONCAT44(local_460._4_4_,options.Fact);
                      options.Fact = DOFACT;
                      sp_preorder(&options,&A,perm_c,local_360,&AC);
                      iVar3 = (int)local_448;
                      cgstrf(&options,&AC,local_3dc,local_3d8,piVar6,local_3b0,iVar3,local_400,
                             local_3f8,&L,&U,&Glu,&stat,&info);
                      if (((long)info != 0) &&
                         (printf("** First factor: info %lld, equed %c\n",(long)info,
                                 (ulong)(uint)(int)main::equed[0]), iVar3 == -1)) {
                        printf("** Estimated memory: %lld bytes\n",(long)info - (long)n);
LAB_00102a82:
                        exit(0);
                      }
                      Destroy_CompCol_Permuted(&AC);
                      options.Fact = local_460._0_4_;
                      uVar9 = extraout_RDX_01;
                    }
LAB_00102342:
                    uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
                    lVar14 = 0;
                    do {
                      local_340 = (uint)uVar9;
                      trans = main::transs[lVar14];
                      local_348 = uVar15;
                      options.Trans = trans;
                      cCopy_CompCol_Matrix(&ASAV,&A);
                      uVar2 = local_470;
                      local_460 = (double)CONCAT44(local_460._4_4_,trans);
                      cFillRHS(trans,local_470,local_390,(int)uVar18,&A,&B);
                      psVar5 = local_358;
                      iVar3 = (int)local_350;
                      cCopy_Dense_Matrix(m,uVar2,local_358,iVar3,local_388,iVar3);
                      perm_c = local_400;
                      uVar12 = local_448;
                      uVar15 = local_348;
                      piVar6 = local_3a8;
                      if ((int)lVar14 == 0 && options.Fact == DOFACT) {
                        cCopy_Dense_Matrix(m,uVar2,psVar5,iVar3,local_418,(int)uVar18);
                        perm_c = local_400;
                        cgssv(&options,&A,local_400,local_3f8,&L,&U,&X,&stat,&info);
                        uVar15 = local_348;
                        iVar3 = (int)local_430;
                        if ((info == 0) || (info == iVar3)) {
                          cgst01(m,local_3d0,&A,&L,&U,perm_c,local_3f8,result);
                          uVar15 = local_348;
                          piVar6 = local_3a8;
                          psVar5 = local_3b8;
                          uVar2 = local_470;
                          uVar17 = 1;
                          if (iVar3 == n + 1) {
                            iVar3 = (int)local_350;
                            cCopy_Dense_Matrix(m,local_470,local_358,iVar3,local_3b8,iVar3);
                            uVar18 = local_438;
                            cgst02(local_460._0_4_,m,n,uVar2,&A,local_418,(int)local_438,psVar5,
                                   iVar3,result + 1);
                            uVar17 = 2;
                          }
                          uVar12 = 0;
                          do {
                            if (20.0 <= result[uVar12]) {
                              printf("%10s:n=%d, test(%d)=%12.5g\n",SUB84((double)result[uVar12],0),
                                     "cgssv",(ulong)(uint)n,uVar12 & 0xffffffff);
                              uVar15 = (ulong)((int)uVar15 + 1);
                            }
                            uVar12 = uVar12 + 1;
                          } while (uVar17 != uVar12);
                          local_454 = uVar17 + local_454;
                          perm_c = local_400;
                        }
                        else {
                          printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n",
                                 "cgssv",(ulong)(uint)info,(ulong)local_430 & 0xffffffff,
                                 (ulong)(uint)n,(ulong)local_470,(ulong)local_46c,local_348);
                          piVar6 = local_3a8;
                        }
                        uVar12 = local_448;
                        if (0 < n) {
                          lVar14 = 0;
                          do {
                            perm_c[lVar14] = piVar6[lVar14];
                            lVar14 = lVar14 + 1;
                          } while (lVar14 < n);
                        }
                        if ((int)local_448 == 0) {
                          Destroy_SuperNode_Matrix(&L);
                          Destroy_CompCol_Matrix(&U);
                        }
                      }
                      if (((options.Fact == FACTORED) && (local_420 != NO)) && (0 < n)) {
                        claqgs(&A,local_408,local_410,rowcnd,colcnd,amax,main::equed);
                      }
                      cgssvx(&options,&A,perm_c,local_3f8,local_360,main::equed,local_408,local_410,
                             &L,&U,local_3b0,(int)uVar12,&B,&X,&rpg,&rcond,local_398,local_3a0,&Glu,
                             &mem_usage,&stat,&info);
                      if ((info == 0) || (info == (int)local_430)) {
                        bVar19 = local_41c == SamePattern_SameRowPerm;
                        if (!bVar19) {
                          cgst01(m,local_3d0,&A,&L,&U,perm_c,local_3f8,result);
                        }
                        psVar5 = local_3b8;
                        uVar2 = local_470;
                        uVar12 = (ulong)bVar19;
                        uVar8 = local_3f0;
                        if (info == 0) {
                          iVar3 = (int)local_350;
                          cCopy_Dense_Matrix(m,local_470,local_388,iVar3,local_3b8,iVar3);
                          cgst02(local_460._0_4_,m,n,uVar2,&ASAV,local_418,(int)local_438,psVar5,
                                 iVar3,result + 1);
                          psVar5 = local_390;
                          cgst04(n,uVar2,local_418,(int)local_438,local_390,(int)local_438,rcond,
                                 result + 2);
                          piVar6 = local_3a8;
                          uVar18 = local_438;
                          cgst07(local_460._0_4_,n,uVar2,&ASAV,local_388,iVar3,local_418,
                                 (int)local_438,psVar5,(int)local_438,local_398,local_3a0,result + 3
                                );
                          uVar8 = local_3f0;
                          do {
                            if (20.0 <= result[uVar12]) {
                              printf("%10s:fact=%4d, trans=%4d, equed=%c, n=%d, imat=%d, test(%d)=%12.5g\n"
                                     ,SUB84((double)result[uVar12],0),"cgssvx",(ulong)options.Fact,
                                     (ulong)local_460 & 0xffffffff,(ulong)(uint)(int)main::equed[0],
                                     (ulong)(uint)n,(ulong)local_46c,uVar12);
                              uVar15 = (ulong)((int)uVar15 + 1);
                              uVar8 = local_3f0;
                            }
                            uVar12 = uVar12 + 1;
                          } while (uVar12 != 5);
                          local_454 = local_454 + 5;
                          perm_c = local_400;
                        }
                      }
                      else {
                        printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n","cgssvx"
                               ,(ulong)(uint)info,local_430,(ulong)(uint)n,(ulong)local_470,
                               (ulong)local_46c,uVar15);
                        uVar8 = local_3f0;
                        if ((int)uVar12 == -1) {
                          printf("** Estimated memory: %.0f bytes\n",
                                 SUB84((double)mem_usage.total_needed,0));
                          goto LAB_00102a82;
                        }
                      }
                      lVar14 = 1;
                      uVar9 = 0;
                    } while ((local_340 & 1) != 0);
                    if ((int)local_448 == 0) {
                      Destroy_SuperNode_Matrix(&L);
                      Destroy_CompCol_Matrix(&U);
                      uVar8 = local_3f0;
                    }
                  }
                  yVar11 = YES;
                  uVar2 = local_3d4 & 1;
                  local_3d4 = 0;
                } while (uVar2 != 0);
              } while ((local_3c0 == 0) && (uVar12 = uVar8 + 1, uVar8 < 3));
              lVar14 = local_3c0 + 1;
            } while (lVar14 != 4);
            Destroy_SuperMatrix_Store(&A);
            Destroy_SuperMatrix_Store(&ASAV);
            StatFree(&stat);
          }
          else {
            local_471 = uVar17 - 8 < 0xfffffffd;
            if (((bool)local_471) || ((int)(uVar17 - 4) <= n)) {
              local_460 = (double)CONCAT44(local_460._4_4_,uVar17 - 8);
              clatb4_slu(main::path,(int *)&local_46c,&n,&n,main::sym,&kl,&ku,&anorm,&mode,&cndnum,
                         main::dist);
              clatms_slu(&n,&n,main::dist,iseed,main::sym,local_368,&mode,&cndnum,&anorm,&kl,&ku,
                         "No packing",local_3e8,&lda,local_3b8,&info1);
              uVar18 = local_438;
              if (info1 == 0) {
                if (local_460._0_4_ < 0xfffffffd) {
                  local_430 = (float *)(ulong)(n + 1);
                }
                else {
                  if (local_46c == 5) {
                    local_430 = (float *)0x1;
LAB_00101f58:
                    iVar3 = (int)local_430 + -1;
                  }
                  else {
                    if (local_46c == 6) {
                      local_430 = (float *)(ulong)(uint)n;
                      goto LAB_00101f58;
                    }
                    iVar3 = n / 2;
                    local_430 = (float *)(ulong)(iVar3 + 1);
                    if (6 < (int)local_46c) {
                      if (iVar3 < n) {
                        iVar4 = iVar3 * lda;
                        iVar13 = 0;
                        do {
                          uVar12 = (ulong)(uint)n;
                          iVar1 = iVar4;
                          if (0 < n) {
                            do {
                              local_3e8[iVar1].r = 0.0;
                              local_3e8[iVar1].i = 0.0;
                              uVar12 = uVar12 - 1;
                              iVar1 = iVar1 + 1;
                            } while (uVar12 != 0);
                          }
                          iVar13 = iVar13 + 1;
                          iVar4 = iVar4 + lda;
                        } while (iVar13 != n - iVar3);
                      }
                      goto LAB_00101fc6;
                    }
                  }
                  if (0 < (long)n) {
                    memset(local_3e8 + iVar3 * lda,0,(long)n << 3);
                  }
                }
LAB_00101fc6:
                sp_cconvert(n,n,local_3e8,lda,kl,ku,a,asub,xa,&nnz);
                goto LAB_00102008;
              }
              printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n","CLATMS",
                     (ulong)(uint)info1,local_430,(ulong)(uint)n,(ulong)local_470,(ulong)local_46c,
                     uVar15);
            }
          }
          uVar17 = local_46c + 1;
          bVar19 = (int)local_424 <= (int)local_46c;
          local_46c = uVar17;
          if (bVar19) {
LAB_00101bf7:
            PrintSumm("CGE",(int)uVar15,local_454,0);
            if (main::matrix_type[2] == '\0' && main::matrix_type._0_2_ == 0x414c) {
              superlu_free(local_3e8);
            }
            superlu_free(local_358);
            superlu_free(local_388);
            superlu_free(local_418);
            superlu_free(local_390);
            superlu_free(local_360);
            superlu_free(local_3f8);
            superlu_free(perm_c);
            superlu_free(piVar6);
            superlu_free(local_408);
            superlu_free(local_410);
            superlu_free(local_398);
            superlu_free(local_3a0);
            superlu_free(local_368);
            superlu_free(local_3b8);
            Destroy_SuperMatrix_Store(&B);
            Destroy_SuperMatrix_Store(&X);
            superlu_free(a);
            superlu_free(asub);
            superlu_free(xa);
            superlu_free(a_save);
            superlu_free(asub_save);
            superlu_free(xa_save);
            if (0 < (int)local_448) {
              superlu_free(local_3b0);
              Destroy_SuperMatrix_Store(&L);
              Destroy_SuperMatrix_Store(&U);
            }
            return (int)((int)uVar15 != 0);
          }
        } while( true );
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    singlecomplex         *a, *a_save;
    int_t          *asub, *asub_save;
    int_t          *xa, *xa_save;
    SuperMatrix  A, B, X, L, U;
    SuperMatrix  ASAV, AC;
    GlobalLU_t   Glu; /* Not needed on return. */
    mem_usage_t    mem_usage;
    int            *perm_r; /* row permutation from partial pivoting */
    int            *perm_c, *pc_save; /* column permutation */
    int            *etree;
    singlecomplex  zero = {0.0, 0.0};
    float         *R, *C;
    float         *ferr, *berr;
    float         *rwork;
    singlecomplex	   *wwork;
    void           *work = NULL;
    int            nrhs, panel_size, relax;
    int            m, n, info1;
    int_t          nnz, lwork, info;
    singlecomplex         *xact;
    singlecomplex         *rhsb, *solx, *bsav;
    int            ldb, ldx;
    float         rpg, rcond;
    int            i, j, k1;
    float         rowcnd, colcnd, amax;
    int            maxsuper, rowblk, colblk;
    int            prefact, equil, iequed;
    int            nt, nrun, nfail, nerrs, imat, fimat, nimat;
    int            nfact, ifact, itran;
    int            kl, ku, mode, lda, ioff;
    int            zerot; /* indicate whether the matrix is singular */
    int            izero; /* indicate the first column that is entirely zero */
    double         u;
    float         anorm, cndnum;
    singlecomplex         *Afull;
    float         result[NTESTS];
    superlu_options_t options;
    fact_t         fact;
    trans_t        trans;
    SuperLUStat_t  stat;
    static char    matrix_type[8];
    static char    equed[1], path[4], sym[1], dist[1];
    FILE           *fp;

    /* Fixed set of parameters */
    int            iseed[]  = {1988, 1989, 1990, 1991};
    static char    equeds[]  = {'N', 'R', 'C', 'B'};
    static fact_t  facts[] = {FACTORED, DOFACT, SamePattern,
			      SamePattern_SameRowPerm};
    static trans_t transs[]  = {NOTRANS, TRANS, CONJ};

    /* Some function prototypes */ 
    extern int cgst01(int, int, SuperMatrix *, SuperMatrix *, 
		      SuperMatrix *, int *, int *, float *);
    extern int cgst02(trans_t, int, int, int, SuperMatrix *, singlecomplex *,
                      int, singlecomplex *, int, float *resid);
    extern int cgst04(int, int, singlecomplex *, int, 
                      singlecomplex *, int, float rcond, float *resid);
    extern int cgst07(trans_t, int, int, SuperMatrix *, singlecomplex *, int,
                         singlecomplex *, int, singlecomplex *, int, 
                         float *, float *, float *);
    extern int clatb4_slu(char *, int *, int *, int *, char *, int *, int *, 
	               float *, int *, float *, char *);
    extern int clatms_slu(int *, int *, char *, int *, char *, float *d,
                       int *, float *, float *, int *, int *,
                       char *, singlecomplex *, int *, singlecomplex *, int *);
    extern int sp_cconvert(int, int, singlecomplex *, int, int, int,
	                   singlecomplex *a, int_t *, int_t *, int_t *);


    /* Executable statements */

    strcpy(path, "CGE");
    nrun  = 0;
    nfail = 0;
    nerrs = 0;

    /* Defaults */
    lwork      = 0;
    n          = 1;
    nrhs       = 1;
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);
    u          = 1.0;
    strcpy(matrix_type, "LA");
    parse_command_line(argc, argv, matrix_type, &n,
		       &panel_size, &relax, &nrhs, &maxsuper,
		       &rowblk, &colblk, &lwork, &u, &fp);
    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) {
	    fprintf(stderr, "expert: cannot allocate %lld bytes\n", (long long) lwork);
	    exit (-1);
	}
    }

    /* Set the default input options. */
    set_default_options(&options);
    options.DiagPivotThresh = u;
    options.PrintStat = NO;
    options.PivotGrowth = YES;
    options.ConditionNumber = YES;
    options.IterRefine = SLU_SINGLE;
    
    if ( strcmp(matrix_type, "LA") == 0 ) {
	/* Test LAPACK matrix suite. */
	m = n;
	lda = SUPERLU_MAX(n, 1);
	nnz = n * n;        /* upper bound */
	fimat = 1;
	nimat = NTYPES;
	Afull = singlecomplexCalloc(lda * n);
	callocateA(n, nnz, &a, &asub, &xa);
    } else {
	/* Read a sparse matrix */
	fimat = nimat = 0;
	creadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
    }

    callocateA(n, nnz, &a_save, &asub_save, &xa_save);
    rhsb = singlecomplexMalloc(m * nrhs);
    bsav = singlecomplexMalloc(m * nrhs);
    solx = singlecomplexMalloc(n * nrhs);
    xact = singlecomplexMalloc(n * nrhs);
    wwork = singlecomplexCalloc( SUPERLU_MAX(m,n) * SUPERLU_MAX(4,nrhs) );

    ldb  = m;
    ldx  = n;
    cCreate_Dense_Matrix(&B, m, nrhs, rhsb, ldb, SLU_DN, SLU_C, SLU_GE);
    cCreate_Dense_Matrix(&X, n, nrhs, solx, ldx, SLU_DN, SLU_C, SLU_GE);
    etree   = int32Malloc(n);
    perm_r  = int32Malloc(n);
    perm_c  = int32Malloc(n);
    pc_save = int32Malloc(n);
    R       = (float *) SUPERLU_MALLOC(m*sizeof(float));
    C       = (float *) SUPERLU_MALLOC(n*sizeof(float));
    ferr    = (float *) SUPERLU_MALLOC(nrhs*sizeof(float));
    berr    = (float *) SUPERLU_MALLOC(nrhs*sizeof(float));
    j = SUPERLU_MAX(m,n) * SUPERLU_MAX(4,nrhs);    
    rwork   = (float *) SUPERLU_MALLOC(j*sizeof(float));
    for (i = 0; i < j; ++i) rwork[i] = 0.;
    if ( !R ) ABORT("SUPERLU_MALLOC fails for R");
    if ( !C ) ABORT("SUPERLU_MALLOC fails for C");
    if ( !ferr ) ABORT("SUPERLU_MALLOC fails for ferr");
    if ( !berr ) ABORT("SUPERLU_MALLOC fails for berr");
    if ( !rwork ) ABORT("SUPERLU_MALLOC fails for rwork");

    for (i = 0; i < n; ++i) perm_c[i] = pc_save[i] = i;
    options.ColPerm = MY_PERMC;

    for (imat = fimat; imat <= nimat; ++imat) { /* All matrix types */
	
	if ( imat ) {

	    /* Skip types 5, 6, or 7 if the matrix size is too small. */
	    zerot = (imat >= 5 && imat <= 7);
	    if ( zerot && n < imat-4 )
		continue;
	    
	    /* Set up parameters with CLATB4 and generate a test matrix
	       with CLATMS.  */
	    clatb4_slu(path, &imat, &n, &n, sym, &kl, &ku, &anorm, &mode,
		    &cndnum, dist);

	    clatms_slu(&n, &n, dist, iseed, sym, &rwork[0], &mode, &cndnum,
		    &anorm, &kl, &ku, "No packing", Afull, &lda,
		    &wwork[0], &info1);

	    if ( info1 ) {
		printf(FMT3, "CLATMS", info1, izero, n, nrhs, imat, nfail);
		continue;
	    }

	    /* For types 5-7, zero one or more columns of the matrix
	       to test that INFO is returned correctly.   */
	    if ( zerot ) {
		if ( imat == 5 ) izero = 1;
		else if ( imat == 6 ) izero = n;
		else izero = n / 2 + 1;
		ioff = (izero - 1) * lda;
		if ( imat < 7 ) {
		    for (i = 0; i < n; ++i) Afull[ioff + i] = zero;
		} else {
		    for (j = 0; j < n - izero + 1; ++j)
			for (i = 0; i < n; ++i)
			    Afull[ioff + i + j*lda] = zero;
		}
	    } else {
		izero = n+1; /* none of the column is zero */
	    }

	    /* Convert to sparse representation. */
	    sp_cconvert(n, n, Afull, lda, kl, ku, a, asub, xa, &nnz);

	} else {
	    izero = n+1; /* none of the column is zero */
	    zerot = 0;
	}
	
	cCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_C, SLU_GE);

	/* Save a copy of matrix A in ASAV */
	cCreate_CompCol_Matrix(&ASAV, m, n, nnz, a_save, asub_save, xa_save,
			      SLU_NC, SLU_C, SLU_GE);
	cCopy_CompCol_Matrix(&A, &ASAV);
	
	/* Form exact solution. */
	cGenXtrue(n, nrhs, xact, ldx);
	
	StatInit(&stat);

	for (iequed = 0; iequed < 4; ++iequed) {
	    *equed = equeds[iequed];
	    if (iequed == 0) nfact = 4;
	    else nfact = 1; /* Only test factored, pre-equilibrated matrix */

	    for (ifact = 0; ifact < nfact; ++ifact) {
		fact = facts[ifact];
		options.Fact = fact;

		for (equil = 0; equil < 2; ++equil) {
		    options.Equil = equil;
		    prefact   = ( options.Fact == FACTORED ||
				  options.Fact == SamePattern_SameRowPerm );
                                /* Need a first factor */

		    /* Restore the matrix A. */
		    cCopy_CompCol_Matrix(&ASAV, &A);
			
		    if ( zerot ) {
                        if ( prefact ) continue;
		    } else if ( options.Fact == FACTORED ) {
                        if ( equil || iequed ) {
			    /* Compute row and column scale factors to
			       equilibrate matrix A.    */
			    cgsequ(&A, R, C, &rowcnd, &colcnd, &amax, &info1);

			    /* Force equilibration. */
			    if ( !info && n > 0 ) {
				if ( strncmp(equed, "R", 1)==0 ) {
				    rowcnd = 0.;
				    colcnd = 1.;
				} else if ( strncmp(equed, "C", 1)==0 ) {
				    rowcnd = 1.;
				    colcnd = 0.;
				} else if ( strncmp(equed, "B", 1)==0 ) {
				    rowcnd = 0.;
				    colcnd = 0.;
				}
			    }
			
			    /* Equilibrate the matrix. */
			    claqgs(&A, R, C, rowcnd, colcnd, amax, equed);
			}
		    }
		    
		    if ( prefact ) { /* Need a factor for the first time */
			
		        /* Save Fact option. */
		        fact = options.Fact;
			options.Fact = DOFACT;

			/* Preorder the matrix, obtain the column etree. */
			sp_preorder(&options, &A, perm_c, etree, &AC);

			/* Factor the matrix AC. */
			cgstrf(&options, &AC, relax, panel_size,
                               etree, work, lwork, perm_c, perm_r, &L, &U,
                               &Glu, &stat, &info);

			if ( info ) { 
                            printf("** First factor: info %lld, equed %c\n",
				   (long long) info, *equed);
                            if ( lwork == -1 ) {
                                printf("** Estimated memory: %lld bytes\n",
                                        (long long) info - n);
                                exit(0);
                            }
                        }
	
                        Destroy_CompCol_Permuted(&AC);
			
		        /* Restore Fact option. */
			options.Fact = fact;
		    } /* if .. first time factor */
		    
		    for (itran = 0; itran < NTRAN; ++itran) {
			trans = transs[itran];
                        options.Trans = trans;

			/* Restore the matrix A. */
			cCopy_CompCol_Matrix(&ASAV, &A);
			
 			/* Set the right hand side. */
			cFillRHS(trans, nrhs, xact, ldx, &A, &B);
			cCopy_Dense_Matrix(m, nrhs, rhsb, ldb, bsav, ldb);

			/*----------------
			 * Test cgssv
			 *----------------*/
			if ( options.Fact == DOFACT && itran == 0) {
                            /* Not yet factored, and untransposed */
	
			    cCopy_Dense_Matrix(m, nrhs, rhsb, ldb, solx, ldx);
			    cgssv(&options, &A, perm_c, perm_r, &L, &U, &X,
                                  &stat, &info);
			    
			    if ( info && info != izero ) {
                                printf(FMT3, "cgssv",
				       (int) info, izero, n, nrhs, imat, nfail);
			    } else {
                                /* Reconstruct matrix from factors and compute residual.
				 * Only compute the leading 'izero' nonzero columns.
				 */
                                cgst01(m, izero-1, &A, &L, &U, perm_c, perm_r,
                                         &result[0]);
				nt = 1;
				if ( izero == (n+1) ) {
				    /* Compute residual of the computed
				       solution. */
				    cCopy_Dense_Matrix(m, nrhs, rhsb, ldb,
						       wwork, ldb);
				    cgst02(trans, m, n, nrhs, &A, solx,
                                              ldx, wwork,ldb, &result[1]);
				    nt = 2;
				}
				
				/* Print information about the tests that
				   did not pass the threshold.      */
				for (i = 0; i < nt; ++i) {
				    if ( result[i] >= THRESH ) {
					printf(FMT1, "cgssv", n, i,
					       result[i]);
					++nfail;
				    }
				}
				nrun += nt;
			    } /* else .. info == 0 */

			    /* Restore perm_c. */
			    for (i = 0; i < n; ++i) perm_c[i] = pc_save[i];

		            if (lwork == 0) {
			        Destroy_SuperNode_Matrix(&L);
			        Destroy_CompCol_Matrix(&U);
			    }
			} /* if .. end of testing cgssv */
    
			/*----------------
			 * Test cgssvx
			 *----------------*/
    
			/* Equilibrate the matrix if fact = FACTORED and
			   equed = 'R', 'C', or 'B'.   */
			if ( options.Fact == FACTORED &&
			     (equil || iequed) && n > 0 ) {
			    claqgs(&A, R, C, rowcnd, colcnd, amax, equed);
			}
			
			/* Solve the system and compute the condition number
			   and error bounds using cgssvx.      */
			cgssvx(&options, &A, perm_c, perm_r, etree,
                               equed, R, C, &L, &U, work, lwork, &B, &X, &rpg,
                               &rcond, ferr, berr, &Glu,
			       &mem_usage, &stat, &info);

			if ( info && info != izero ) {
			    printf(FMT3, "cgssvx",
				   (int) info, izero, n, nrhs, imat, nfail);
                            if ( lwork == -1 ) {
                                printf("** Estimated memory: %.0f bytes\n",
                                        mem_usage.total_needed);
                                exit(0);
                            }
			} else {
			    if ( !prefact ) {
			    	/* Reconstruct matrix from factors and compute residual.
				 * Only compute the leading 'izero' nonzero columns.
				 */
                                cgst01(m, izero-1, &A, &L, &U, perm_c, perm_r,
                                         &result[0]);
				k1 = 0;
			    } else {
			   	k1 = 1;
			    }

			    if ( !info ) {
				/* Compute residual of the computed solution.*/
				cCopy_Dense_Matrix(m, nrhs, bsav, ldb,
						  wwork, ldb);
				cgst02(trans, m, n, nrhs, &ASAV, solx, ldx,
					  wwork, ldb, &result[1]);

				/* Check solution from generated exact
				   solution. */
				cgst04(n, nrhs, solx, ldx, xact, ldx, rcond,
					  &result[2]);

				/* Check the error bounds from iterative
				   refinement. */
				cgst07(trans, n, nrhs, &ASAV, bsav, ldb,
					  solx, ldx, xact, ldx, ferr, berr,
					  &result[3]);

				/* Print information about the tests that did
				   not pass the threshold.    */
				for (i = k1; i < NTESTS; ++i) {
				    if ( result[i] >= THRESH ) {
					printf(FMT2, "cgssvx",
					       options.Fact, trans, *equed,
					       n, imat, i, result[i]);
					++nfail;
				    }
				}
				nrun += NTESTS;
			    } /* if .. info == 0 */
			} /* else .. end of testing cgssvx */

		    } /* for itran ... */

		    if ( lwork == 0 ) {
			Destroy_SuperNode_Matrix(&L);
			Destroy_CompCol_Matrix(&U);
		    }

		} /* for equil ... */
	    } /* for ifact ... */
	} /* for iequed ... */
#if 0    
    if ( !info ) {
	PrintPerf(&L, &U, &mem_usage, rpg, rcond, ferr, berr, equed);
    }
#endif
        Destroy_SuperMatrix_Store(&A);
        Destroy_SuperMatrix_Store(&ASAV);
        StatFree(&stat);

    } /* for imat ... */

    /* Print a summary of the results. */
    PrintSumm("CGE", nfail, nrun, nerrs);

    if ( strcmp(matrix_type, "LA") == 0 ) SUPERLU_FREE (Afull);
    SUPERLU_FREE (rhsb);
    SUPERLU_FREE (bsav);
    SUPERLU_FREE (solx);    
    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (pc_save);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    SUPERLU_FREE (ferr);
    SUPERLU_FREE (berr);
    SUPERLU_FREE (rwork);
    SUPERLU_FREE (wwork);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperMatrix_Store(&X);
#if 0
    Destroy_CompCol_Matrix(&A);
    Destroy_CompCol_Matrix(&ASAV);
#else
    SUPERLU_FREE(a); SUPERLU_FREE(asub); SUPERLU_FREE(xa);
    SUPERLU_FREE(a_save); SUPERLU_FREE(asub_save); SUPERLU_FREE(xa_save);
#endif
    if ( lwork > 0 ) {
	SUPERLU_FREE (work);
	Destroy_SuperMatrix_Store(&L);
	Destroy_SuperMatrix_Store(&U);
    }

    return (nfail == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}